

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O0

bool __thiscall sc_core::sc_event::remove_dynamic(sc_event *this,sc_method_handle method_h_)

{
  int iVar1;
  size_type sVar2;
  reference ppsVar3;
  sc_method_process *in_RSI;
  value_type in_RDI;
  vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_> *unaff_retaddr
  ;
  int i;
  sc_method_handle *l_methods_dynamic;
  int size;
  int local_2c;
  value_type __x;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  __x = in_RDI;
  sVar2 = std::vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>::
          size((vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
                *)&(in_RDI->super_sc_process_b).super_sc_object.m_parent);
  iVar1 = (int)sVar2;
  if (iVar1 == 0) {
LAB_002a2b0e:
    bVar4 = false;
  }
  else {
    ppsVar3 = std::
              vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>::
              operator[]((vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
                          *)&(in_RDI->super_sc_process_b).super_sc_object.m_parent,0);
    local_2c = iVar1;
    do {
      local_2c = local_2c + -1;
      if (local_2c < 0) goto LAB_002a2b0e;
    } while (ppsVar3[local_2c] != in_RSI);
    ppsVar3[local_2c] = ppsVar3[iVar1 + -1];
    std::vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>::resize
              (unaff_retaddr,CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),__x);
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool
sc_event::remove_dynamic( sc_method_handle method_h_ ) const
{
    int size;
    if ( ( size = m_methods_dynamic.size() ) != 0 ) {
      sc_method_handle* l_methods_dynamic = &m_methods_dynamic[0];
      for( int i = size - 1; i >= 0; -- i ) {
          if( l_methods_dynamic[i] == method_h_ ) {
              l_methods_dynamic[i] = l_methods_dynamic[size - 1];
              m_methods_dynamic.resize(size-1);
              return true;
          }
      }
    }
    return false;
}